

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

float64 vector_pdf_entropy(float32 *p,int32 len)

{
  float fVar1;
  double dVar2;
  int local_24;
  double dStack_20;
  int32 i;
  float64 sum;
  int32 len_local;
  float32 *p_local;
  
  dStack_20 = 0.0;
  for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
    if (0.0 < (float)p[local_24]) {
      fVar1 = (float)p[local_24];
      dVar2 = log((double)(float)p[local_24]);
      dStack_20 = -(double)fVar1 * dVar2 + dStack_20;
    }
  }
  dVar2 = log(2.0);
  return (float64)(dStack_20 / dVar2);
}

Assistant:

float64
vector_pdf_entropy(float32 * p, int32 len)
{
    float64 sum;
    int32 i;

    sum = 0.0;
    for (i = 0; i < len; i++) {
        if (p[i] > 0.0)
            sum -= p[i] * log(p[i]);
    }
    sum /= log(2.0);

    return sum;
}